

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void el::Loggers::reconfigureAllLoggers(Configurations *configurations)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  
  puVar1 = (undefined8 *)(**(code **)(**(long **)(base::elStorage + 0x10) + 0x28))();
  while( true ) {
    puVar2 = (undefined8 *)(**(code **)(**(long **)(base::elStorage + 0x10) + 0x30))();
    if (puVar1 == puVar2) break;
    if ((Logger *)puVar1[5] != (Logger *)0x0) {
      Logger::configure((Logger *)puVar1[5],configurations);
    }
    puVar1 = (undefined8 *)*puVar1;
  }
  return;
}

Assistant:

void Loggers::reconfigureAllLoggers(const Configurations& configurations) {
  for (base::RegisteredLoggers::iterator it = ELPP->registeredLoggers()->begin();
       it != ELPP->registeredLoggers()->end(); ++it) {
    Loggers::reconfigureLogger(it->second, configurations);
  }
}